

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O0

void ed_dual_scale(ed *R,limb_t *x,limb_t *y,ed *Q)

{
  int iVar1;
  void *in_RDI;
  int i;
  int n;
  int uy [261];
  int ux [261];
  pced pcQ;
  ed QmB;
  ed QpB;
  ed *in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5e0;
  int local_a18 [4];
  limb_t *in_stack_fffffffffffff5f8;
  limb_t *in_stack_fffffffffffff600;
  int *in_stack_fffffffffffff608;
  int *in_stack_fffffffffffff610;
  ed *in_stack_fffffffffffff748;
  ed *in_stack_fffffffffffff750;
  ed *in_stack_fffffffffffff758;
  ed *in_stack_fffffffffffff760;
  ed *in_stack_fffffffffffff780;
  ed *in_stack_fffffffffffff788;
  ed *in_stack_fffffffffffff790;
  int local_5f8 [382];
  
  memcpy(in_RDI,&ed_zero,0xa0);
  iVar1 = sc_jsf(in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600,
                 in_stack_fffffffffffff5f8);
  if (iVar1 != -1) {
    ed_add_pc(in_stack_fffffffffffff760,in_stack_fffffffffffff758,(pced *)in_stack_fffffffffffff750)
    ;
    ed_sub_pc(in_stack_fffffffffffff760,in_stack_fffffffffffff758,(pced *)in_stack_fffffffffffff750)
    ;
    ed_precompute((pced *)CONCAT44(iVar1,in_stack_fffffffffffff5e0),in_stack_fffffffffffff5d8);
    while( true ) {
      if (local_5f8[iVar1] == 1) {
        if (local_a18[iVar1] == 1) {
          ed_add(in_stack_fffffffffffff790,in_stack_fffffffffffff788,in_stack_fffffffffffff780);
        }
        else if (local_a18[iVar1] == -1) {
          ed_sub(in_stack_fffffffffffff790,in_stack_fffffffffffff788,in_stack_fffffffffffff780);
        }
        else {
          ed_add_pc(in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                    (pced *)in_stack_fffffffffffff750);
        }
      }
      else if (local_5f8[iVar1] == -1) {
        if (local_a18[iVar1] == 1) {
          ed_add(in_stack_fffffffffffff790,in_stack_fffffffffffff788,in_stack_fffffffffffff780);
        }
        else if (local_a18[iVar1] == -1) {
          ed_sub(in_stack_fffffffffffff790,in_stack_fffffffffffff788,in_stack_fffffffffffff780);
        }
        else {
          ed_sub_pc(in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                    (pced *)in_stack_fffffffffffff750);
        }
      }
      else if (local_a18[iVar1] == 1) {
        ed_add_pc(in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                  (pced *)in_stack_fffffffffffff750);
      }
      else if (local_a18[iVar1] == -1) {
        ed_sub_pc(in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                  (pced *)in_stack_fffffffffffff750);
      }
      if (iVar1 == 0) break;
      ed_double(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      iVar1 = iVar1 + -1;
    }
  }
  return;
}

Assistant:

void
ed_dual_scale(struct ed *R,
	      const sc_t x,
	      const sc_t y, const struct ed *Q)
{
	struct ed QpB, QmB;
	struct pced pcQ;

	int ux[SC_BITS+1], uy[SC_BITS+1];
	int n, i;

	memcpy(R, &ed_zero, sizeof(struct ed));

	/* calculate joint sparse form of x and y */
	n = sc_jsf(ux, uy, x, y);
	if (n == -1)
		return;

	/* precompute Q, Q+B and Q-B */
	ed_add_pc(&QpB, Q, &pced_B);
	ed_sub_pc(&QmB, Q, &pced_B);
	ed_precompute(&pcQ, Q);
	
	/* now we calculate R = x * base_point + y * Q using fast shamir method */
	for (i = n; ; i--) {
		if (ux[i] == 1) {
			if (uy[i] == 1)
				ed_add(R, R, &QpB);
			else if (uy[i] == -1)
				ed_sub(R, R, &QmB);
			else
				ed_add_pc(R, R, &pced_B);
			
		} else if (ux[i] == -1) {
			if (uy[i] == 1)
				ed_add(R, R, &QmB);
			else if (uy[i] == -1)
				ed_sub(R, R, &QpB);
			else
				ed_sub_pc(R, R, &pced_B);

		} else {
			if (uy[i] == 1)
				ed_add_pc(R, R, &pcQ);
			else if (uy[i] == -1)
				ed_sub_pc(R, R, &pcQ);
		}

		if (i == 0) break;

		ed_double(R, R);
	}
}